

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_quass.cpp
# Opt level: O2

QpAsmStatus
quass2highs(Instance *instance,Settings *settings,Statistics *stats,QpModelStatus *qp_model_status,
           QpSolution *qp_solution,HighsModelStatus *highs_model_status,HighsBasis *highs_basis,
           HighsSolution *highs_solution)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  size_type sVar6;
  pointer pHVar7;
  pointer pHVar8;
  HighsInt HVar9;
  ulong uVar10;
  QpAsmStatus QVar11;
  ulong uVar12;
  undefined1 uVar13;
  HighsBasisStatus HVar14;
  
  Eventhandler<QpModelStatus_&>::fire(&settings->qp_model_status_log,(QpModelStatus *)stats);
  QVar11 = kOk;
  switch(stats->phase1_iterations) {
  default:
    (qp_solution->primal).num_nz = 0;
    return kError;
  case 1:
  case 7:
  case 9:
    (qp_solution->primal).num_nz = 4;
    return kError;
  case 2:
    HVar9 = 7;
    goto LAB_00322732;
  case 3:
    HVar9 = 10;
    goto LAB_00322732;
  case 4:
    HVar9 = 8;
    goto LAB_00322732;
  case 5:
    HVar9 = 0xe;
    break;
  case 6:
    HVar9 = 0xd;
    break;
  case 8:
    HVar9 = 0x11;
  }
  QVar11 = kWarning;
LAB_00322732:
  (qp_solution->primal).num_nz = HVar9;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)&highs_basis->debug_update_count,
             (long)instance->num_var);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)&(highs_basis->debug_origin_name).field_2,
             (long)instance->num_var);
  uVar3 = *(undefined8 *)(qp_model_status + 8);
  uVar4 = *(undefined8 *)(qp_model_status + 0x24);
  lVar5 = *(long *)&highs_basis->debug_update_count;
  sVar6 = (highs_basis->debug_origin_name).field_2._M_allocated_capacity;
  iVar1 = instance->sense;
  uVar12 = 0;
  uVar10 = (ulong)(uint)instance->num_var;
  if (instance->num_var < 1) {
    uVar10 = uVar12;
  }
  for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
    *(undefined8 *)(lVar5 + uVar12 * 8) = *(undefined8 *)(uVar3 + uVar12 * 8);
    *(double *)(sVar6 + uVar12 * 8) = *(double *)(uVar4 + uVar12 * 8) * (double)iVar1;
  }
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             &(highs_basis->col_status).
              super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
              super__Vector_impl_data._M_finish,(long)instance->num_con);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             &(highs_basis->row_status).
              super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
              super__Vector_impl_data._M_finish,(long)instance->num_con);
  uVar3 = *(undefined8 *)(qp_model_status + 0x16);
  uVar4 = *(undefined8 *)(qp_model_status + 0x32);
  pHVar7 = (highs_basis->col_status).
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pHVar8 = (highs_basis->row_status).
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar1 = instance->sense;
  uVar12 = 0;
  uVar10 = (ulong)(uint)instance->num_con;
  if (instance->num_con < 1) {
    uVar10 = uVar12;
  }
  for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
    *(undefined8 *)(pHVar7 + uVar12 * 8) = *(undefined8 *)(uVar3 + uVar12 * 8);
    *(double *)(pHVar8 + uVar12 * 8) = *(double *)(uVar4 + uVar12 * 8) * (double)iVar1;
  }
  highs_basis->valid = true;
  highs_basis->alien = true;
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
             (highs_model_status + 0xc),(long)instance->num_var);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
             (highs_model_status + 0x12),(long)instance->num_con);
  uVar3 = *(undefined8 *)(qp_model_status + 0x38);
  uVar4 = *(undefined8 *)(highs_model_status + 0xc);
  uVar12 = 0;
  uVar10 = (ulong)(uint)instance->num_var;
  if (instance->num_var < 1) {
    uVar10 = uVar12;
  }
  for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
    uVar2 = *(uint *)(uVar3 + uVar12 * 4);
    uVar13 = (char)(0x4020001 >> ((char)uVar2 * '\b' & 0x1fU));
    if (3 < uVar2) {
      uVar13 = 1;
    }
    *(undefined1 *)(uVar4 + uVar12) = uVar13;
  }
  uVar3 = *(undefined8 *)(qp_model_status + 0x3e);
  pHVar7 = (((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
            (highs_model_status + 0x12))->
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = 0;
  uVar10 = (ulong)(uint)instance->num_con;
  if (instance->num_con < 1) {
    uVar10 = uVar12;
  }
  for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
    uVar2 = *(uint *)(uVar3 + uVar12 * 4);
    HVar14 = (HighsBasisStatus)(0x4020001 >> ((char)uVar2 * '\b' & 0x1fU));
    if (3 < uVar2) {
      HVar14 = kBasic;
    }
    pHVar7[uVar12] = HVar14;
  }
  *(undefined2 *)highs_model_status = kLoadError;
  *(byte *)((long)highs_model_status + 2) = 1;
  return QVar11;
}

Assistant:

static QpAsmStatus quass2highs(Instance& instance, Settings& settings,
                               Statistics& stats,
                               QpModelStatus& qp_model_status,
                               QpSolution& qp_solution,
                               HighsModelStatus& highs_model_status,
                               HighsBasis& highs_basis,
                               HighsSolution& highs_solution) {
  settings.qp_model_status_log.fire(qp_model_status);
  QpAsmStatus qp_asm_return_status = QpAsmStatus::kError;
  switch (qp_model_status) {
    case QpModelStatus::kOptimal:
      highs_model_status = HighsModelStatus::kOptimal;
      qp_asm_return_status = QpAsmStatus::kOk;
      break;
    case QpModelStatus::kUnbounded:
      highs_model_status = HighsModelStatus::kUnbounded;
      qp_asm_return_status = QpAsmStatus::kOk;
      break;
    case QpModelStatus::kInfeasible:
      highs_model_status = HighsModelStatus::kInfeasible;
      qp_asm_return_status = QpAsmStatus::kOk;
      break;
    case QpModelStatus::kIterationLimit:
      highs_model_status = HighsModelStatus::kIterationLimit;
      qp_asm_return_status = QpAsmStatus::kWarning;
      break;
    case QpModelStatus::kTimeLimit:
      highs_model_status = HighsModelStatus::kTimeLimit;
      qp_asm_return_status = QpAsmStatus::kWarning;
      break;
    case QpModelStatus::kInterrupt:
      highs_model_status = HighsModelStatus::kInterrupt;
      qp_asm_return_status = QpAsmStatus::kWarning;
      break;
    case QpModelStatus::kUndetermined:
      highs_model_status = HighsModelStatus::kSolveError;
      qp_asm_return_status = QpAsmStatus::kError;
      return QpAsmStatus::kError;
    case QpModelStatus::kLargeNullspace:
      highs_model_status = HighsModelStatus::kSolveError;
      return QpAsmStatus::kError;
    case QpModelStatus::kError:
      highs_model_status = HighsModelStatus::kSolveError;
      return QpAsmStatus::kError;
    case QpModelStatus::kNotset:
      highs_model_status = HighsModelStatus::kNotset;
      return QpAsmStatus::kError;
    default:
      highs_model_status = HighsModelStatus::kNotset;
      return QpAsmStatus::kError;
  }

  assert(qp_asm_return_status != QpAsmStatus::kError);
  // extract variable values
  highs_solution.col_value.resize(instance.num_var);
  highs_solution.col_dual.resize(instance.num_var);
  for (HighsInt iCol = 0; iCol < instance.num_var; iCol++) {
    highs_solution.col_value[iCol] = qp_solution.primal.value[iCol];
    highs_solution.col_dual[iCol] =
        instance.sense * qp_solution.dualvar.value[iCol];
  }
  // extract constraint activity
  highs_solution.row_value.resize(instance.num_con);
  highs_solution.row_dual.resize(instance.num_con);
  // Negate the vector and Hessian
  for (HighsInt iRow = 0; iRow < instance.num_con; iRow++) {
    highs_solution.row_value[iRow] = qp_solution.rowactivity.value[iRow];
    highs_solution.row_dual[iRow] =
        instance.sense * qp_solution.dualcon.value[iRow];
  }
  highs_solution.value_valid = true;
  highs_solution.dual_valid = true;

  // extract basis status
  highs_basis.col_status.resize(instance.num_var);
  highs_basis.row_status.resize(instance.num_con);

  const bool debug_report =
      false;  // instance.num_var + instance.num_con < 100;
  for (HighsInt i = 0; i < instance.num_var; i++) {
    if (debug_report)
      printf("Column %2d: status %s\n", int(i),
             qpBasisStatusToString(qp_solution.status_var[i]).c_str());
    if (qp_solution.status_var[i] == BasisStatus::kActiveAtLower) {
      highs_basis.col_status[i] = HighsBasisStatus::kLower;
    } else if (qp_solution.status_var[i] == BasisStatus::kActiveAtUpper) {
      highs_basis.col_status[i] = HighsBasisStatus::kUpper;
    } else if (qp_solution.status_var[i] == BasisStatus::kInactiveInBasis) {
      highs_basis.col_status[i] = HighsBasisStatus::kNonbasic;
    } else {
      assert(qp_solution.status_var[i] == BasisStatus::kInactive);
      highs_basis.col_status[i] = HighsBasisStatus::kBasic;
    }
  }

  for (HighsInt i = 0; i < instance.num_con; i++) {
    if (debug_report)
      printf("Row    %2d: status %s\n", int(i),
             qpBasisStatusToString(qp_solution.status_con[i]).c_str());
    if (qp_solution.status_con[i] == BasisStatus::kActiveAtLower) {
      highs_basis.row_status[i] = HighsBasisStatus::kLower;
    } else if (qp_solution.status_con[i] == BasisStatus::kActiveAtUpper) {
      highs_basis.row_status[i] = HighsBasisStatus::kUpper;
    } else if (qp_solution.status_con[i] == BasisStatus::kInactiveInBasis) {
      highs_basis.row_status[i] = HighsBasisStatus::kNonbasic;
    } else {
      assert(qp_solution.status_con[i] == BasisStatus::kInactive);
      highs_basis.row_status[i] = HighsBasisStatus::kBasic;
    }
  }
  highs_basis.valid = true;
  highs_basis.alien = false;
  highs_basis.useful = true;
  return qp_asm_return_status;
}